

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O3

ON_wString * __thiscall ON_UnitSystem::UnitSystemName(ON_UnitSystem *this)

{
  bool bVar1;
  ON_wString *this_00;
  wchar_t *s;
  
  switch(this->m_unit_system) {
  case None:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName::s_name);
    if (!bVar1) {
      return &UnitSystemName::s_name;
    }
    this_00 = &UnitSystemName::s_name;
    s = L"no units";
    break;
  case Microns:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"microns";
    break;
  case Millimeters:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"millimeters";
    break;
  case Centimeters:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"centimeters";
    break;
  case Meters:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"meters";
    break;
  case Kilometers:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"kilometers";
    break;
  case Microinches:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"microinches";
    break;
  case Mils:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"mils";
    break;
  case Inches:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"inches";
    break;
  case Feet:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"feet";
    break;
  case Miles:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"miles";
    break;
  case CustomUnits:
    bVar1 = ON_wString::IsEmpty(&this->m_custom_unit_name);
    if (!bVar1) {
      return &this->m_custom_unit_name;
    }
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"custom units";
    break;
  case Angstroms:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"angstroms";
    break;
  case Nanometers:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"nanometers";
    break;
  case Decimeters:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"decimeters";
    break;
  case Dekameters:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"dekameters";
    break;
  case Hectometers:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"hectometers";
    break;
  case Megameters:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"megameters";
    break;
  case Gigameters:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"gigameters";
    break;
  case Yards:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"yards";
    break;
  case PrinterPoints:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"points";
    break;
  case PrinterPicas:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"picas";
    break;
  case NauticalMiles:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"nautical miles";
    break;
  case AstronomicalUnits:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"astronomical units";
    break;
  case LightYears:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"light years";
    break;
  case Parsecs:
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"parsecs";
    break;
  default:
    if (this->m_unit_system != Unset) {
      return &ON_wString::EmptyString;
    }
    if (UnitSystemName()::s_name == '\0') {
      UnitSystemName();
    }
    bVar1 = ON_wString::IsEmpty(&UnitSystemName()::s_name);
    if (!bVar1) {
      return &UnitSystemName()::s_name;
    }
    this_00 = &UnitSystemName()::s_name;
    s = L"unset";
  }
  ON_wString::operator=(this_00,s);
  return this_00;
}

Assistant:

const ON_wString& ON_UnitSystem::UnitSystemName() const
{
  switch (m_unit_system)
  {
  case ON::LengthUnitSystem::None:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"no units",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Angstroms:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"angstroms",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Nanometers:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"nanometers",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Microns:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"microns",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Millimeters:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"millimeters",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Decimeters:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"decimeters",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Centimeters:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"centimeters",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Meters:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"meters",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Dekameters:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"dekameters",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Hectometers:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"hectometers",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Kilometers:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"kilometers",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Megameters:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"megameters",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Gigameters:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"gigameters",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Microinches:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"microinches",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Mils:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"mils",s_name);// (= 0.001 inches)";
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Inches:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"inches",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Feet:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"feet",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Yards:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"yards",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Miles:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"miles",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::PrinterPoints:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"points",s_name); // (1/72 inch)";
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::PrinterPicas:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"picas",s_name); // (1/6 inch)";
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::NauticalMiles:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"nautical miles",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::AstronomicalUnits:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"astronomical units",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::LightYears:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"light years",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Parsecs:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"parsecs",s_name);
      return s_name;
    }
    break;

  case ON::LengthUnitSystem::CustomUnits:
    if (m_custom_unit_name.IsEmpty())
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"custom units", s_name);
      return s_name;
    }
    return m_custom_unit_name;
    break;

  case ON::LengthUnitSystem::Unset:
    {
    static ON_wString s_name;
    ON_Internal_InitUnitSystemName(L"unset", s_name);
    return s_name;
    }
    break;
  }

  return ON_wString::EmptyString;
}